

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

_Bool sparc_cpu_exec_interrupt(CPUState *cs,int interrupt_request)

{
  int iVar1;
  int type;
  int pil;
  CPUSPARCState_conflict1 *env;
  SPARCCPU_conflict1 *cpu;
  int interrupt_request_local;
  CPUState *cs_local;
  
  if ((interrupt_request & 2U) != 0) {
    iVar1 = cpu_interrupts_enabled((CPUSPARCState_conflict1 *)(cs[1].tb_jmp_cache + 0x1f5));
    if (((iVar1 != 0) && (0 < *(int *)(cs[1].tb_jmp_cache + 0x22b))) &&
       ((((ulong)cs[1].tb_jmp_cache[0x22b] & 0xf0) != 0x40 ||
        (iVar1 = cpu_pil_allowed((CPUSPARCState_conflict1 *)(cs[1].tb_jmp_cache + 0x1f5),
                                 *(uint *)(cs[1].tb_jmp_cache + 0x22b) & 0xf), iVar1 != 0)))) {
      cs->exception_index = *(int32_t *)(cs[1].tb_jmp_cache + 0x22b);
      sparc_cpu_do_interrupt_sparc64(cs);
      return true;
    }
  }
  return false;
}

Assistant:

static bool sparc_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    if (interrupt_request & CPU_INTERRUPT_HARD) {
        SPARCCPU *cpu = SPARC_CPU(cs);
        CPUSPARCState *env = &cpu->env;

        if (cpu_interrupts_enabled(env) && env->interrupt_index > 0) {
            int pil = env->interrupt_index & 0xf;
            int type = env->interrupt_index & 0xf0;

            if (type != TT_EXTINT || cpu_pil_allowed(env, pil)) {
                cs->exception_index = env->interrupt_index;
                sparc_cpu_do_interrupt(cs);
                return true;
            }
        }
    }
    return false;
}